

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

TableOfContentsNode * __thiscall
soul::findOrCreateNode
          (soul *this,TableOfContentsNode *node,
          ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          path)

{
  reference this_00;
  bool bVar1;
  __type_conflict1 _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t sVar3;
  TableOfContentsNode *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> AVar6;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_00;
  reference local_f0;
  TableOfContentsNode *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  value_type *n;
  value_type local_a8;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  reference local_50;
  TableOfContentsNode *c;
  iterator __end1;
  iterator __begin1;
  vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *firstPart;
  TableOfContentsNode *node_local;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_local;
  
  pbVar5 = path.e;
  path_local.s = path.s;
  node_local = node;
  bVar1 = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&node_local);
  path_local.e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  if (!bVar1) {
    __lhs = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::front((ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&node_local);
    sVar3 = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&node_local);
    if ((sVar3 != 1) ||
       (_Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this), !_Var2)) {
      __end1 = std::
               vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
               ::begin((vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                        *)(this + 0x20));
      c = (TableOfContentsNode *)
          std::
          vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
          ::end((vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                 *)(this + 0x20));
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<soul::SourceCodeModel::TableOfContentsNode_*,_std::vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>_>
                                         *)&c), bVar1) {
        local_50 = __gnu_cxx::
                   __normal_iterator<soul::SourceCodeModel::TableOfContentsNode_*,_std::vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>_>
                   ::operator*(&__end1);
        _Var2 = std::operator==(__lhs,&local_50->name);
        this_00 = local_50;
        if (_Var2) {
          local_60 = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::tail((ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&node_local);
          AVar6.e = pbVar5;
          AVar6.s = local_60.e;
          pTVar4 = findOrCreateNode((soul *)this_00,(TableOfContentsNode *)local_60.s,AVar6);
          return pTVar4;
        }
        __gnu_cxx::
        __normal_iterator<soul::SourceCodeModel::TableOfContentsNode_*,_std::vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::string::string((string *)&local_a8);
      local_a8.children.
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.children.
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.children.
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ::vector(&local_a8.children);
      local_a8.module = (Module *)0x0;
      local_a8.file = (File *)0x0;
      std::
      vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ::push_back((vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                   *)(this + 0x20),&local_a8);
      SourceCodeModel::TableOfContentsNode::~TableOfContentsNode(&local_a8);
      local_f0 = std::
                 vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                 ::back((vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                         *)(this + 0x20));
      std::__cxx11::string::operator=((string *)local_f0,(string *)__lhs);
      sVar3 = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&node_local);
      if (1 < sVar3) {
        AVar6 = ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::tail((ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&node_local);
        local_d0 = (TableOfContentsNode *)AVar6.s;
        local_c8 = AVar6.e;
        path_00.e = pbVar5;
        path_00.s = local_c8;
        local_f0 = findOrCreateNode((soul *)local_f0,local_d0,path_00);
      }
      path_local.e = &local_f0->name;
    }
  }
  return (TableOfContentsNode *)path_local.e;
}

Assistant:

static SourceCodeModel::TableOfContentsNode& findOrCreateNode (SourceCodeModel::TableOfContentsNode& node,
                                                               ArrayView<std::string> path)
{
    if (path.empty())
        return node;

    auto& firstPart = path.front();

    if (path.size() == 1 && firstPart == node.name)
        return node;

    for (auto& c : node.children)
        if (firstPart == c.name)
            return findOrCreateNode (c, path.tail());

    node.children.push_back ({});
    auto& n = node.children.back();
    n.name = firstPart;
    return path.size() > 1 ? findOrCreateNode (n, path.tail()) : n;
}